

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> __thiscall
cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  size_type sVar1;
  undefined8 extraout_RDX;
  __enable_if_t<is_constructible<value_type,_pair<const_cmLinkItem,_int>_&>::value,_pair<iterator,_bool>_>
  _Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar3;
  int local_74;
  undefined1 local_70 [8];
  value_type index_entry;
  cmLinkItem *item_local;
  cmComputeLinkDepends *this_local;
  __enable_if_t<is_constructible<value_type,_pair<const_cmLinkItem,_int>_&>::value,_pair<iterator,_bool>_>
  lei;
  
  index_entry._64_8_ = item;
  sVar1 = std::
          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          ::size(&this->EntryList);
  local_74 = (int)sVar1;
  std::pair<const_cmLinkItem,_int>::pair<int,_true>
            ((pair<const_cmLinkItem,_int> *)local_70,item,&local_74);
  _Var2 = std::
          map<cmLinkItem,int,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
          ::insert<std::pair<cmLinkItem_const,int>&>
                    ((map<cmLinkItem,int,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
                      *)&this->LinkEntryIndex,(pair<const_cmLinkItem,_int> *)local_70);
  pVar3.first = _Var2.first._M_node;
  pVar3.second = _Var2.second;
  if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
    emplace_back<>(&this->EntryList);
    std::
    vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
    ::emplace_back<>(&this->InferredDependSets);
    std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::emplace_back<>
              (&(this->EntryConstraintGraph).
                super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  }
  std::pair<const_cmLinkItem,_int>::~pair((pair<const_cmLinkItem,_int> *)local_70);
  pVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  return pVar3;
}

Assistant:

std::pair<std::map<cmLinkItem, int>::iterator, bool>
cmComputeLinkDepends::AllocateLinkEntry(cmLinkItem const& item)
{
  std::map<cmLinkItem, int>::value_type index_entry(
    item, static_cast<int>(this->EntryList.size()));
  auto lei = this->LinkEntryIndex.insert(index_entry);
  if (lei.second) {
    this->EntryList.emplace_back();
    this->InferredDependSets.emplace_back();
    this->EntryConstraintGraph.emplace_back();
  }
  return lei;
}